

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O0

IfcVector3 * __thiscall
Assimp::IFC::anon_unknown_9::Line::Eval(IfcVector3 *__return_storage_ptr__,Line *this,IfcFloat u)

{
  aiVector3t<double> local_30;
  IfcFloat local_18;
  IfcFloat u_local;
  Line *this_local;
  
  local_18 = u;
  u_local = (IfcFloat)this;
  ::operator*(&local_30,u,&this->v);
  ::operator+(__return_storage_ptr__,&this->p,&local_30);
  return __return_storage_ptr__;
}

Assistant:

IfcVector3 Eval(IfcFloat u) const {
        return p + u*v;
    }